

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledRgbaOutputFile::ToYa::ToYa
          (ToYa *this,TiledOutputFile *outputFile,RgbaChannels rgbaChannels)

{
  uint uVar1;
  Header *pHVar2;
  TileDescription *pTVar3;
  undefined8 local_20;
  float local_18;
  
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_outputFile = outputFile;
  (this->_buf)._data = (Rgba *)0x0;
  (this->_buf)._sizeX = 0;
  (this->_buf)._sizeY = 0;
  this->_writeA = (bool)((byte)rgbaChannels >> 3 & 1);
  pHVar2 = TiledOutputFile::header(outputFile);
  pTVar3 = Header::tileDescription(pHVar2);
  uVar1 = pTVar3->ySize;
  this->_tileXSize = pTVar3->xSize;
  this->_tileYSize = uVar1;
  pHVar2 = TiledOutputFile::header(this->_outputFile);
  anon_unknown_22::ywFromHeader((anon_unknown_22 *)&local_20,pHVar2);
  (this->_yw).x = (float)(undefined4)local_20;
  (this->_yw).y = (float)local_20._4_4_;
  (this->_yw).z = local_18;
  Array2D<Imf_2_5::Rgba>::resizeErase(&this->_buf,(ulong)this->_tileYSize,(ulong)this->_tileXSize);
  this->_fbBase = (Rgba *)0x0;
  this->_fbXStride = 0;
  this->_fbYStride = 0;
  return;
}

Assistant:

TiledRgbaOutputFile::ToYa::ToYa (TiledOutputFile &outputFile,
				 RgbaChannels rgbaChannels)
:
    _outputFile (outputFile)
{
    _writeA = (rgbaChannels & WRITE_A)? true: false;
    
    const TileDescription &td = outputFile.header().tileDescription();

    _tileXSize = td.xSize;
    _tileYSize = td.ySize;
    _yw = ywFromHeader (_outputFile.header());
    _buf.resizeErase (_tileYSize, _tileXSize);
    _fbBase = 0;
    _fbXStride = 0;
    _fbYStride = 0;
}